

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationRootElements::getTertiaryAfter
          (CollationRootElements *this,int32_t index,uint32_t s,uint32_t t)

{
  uint32_t uVar1;
  uint *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint uVar5;
  
  if (index == 0) {
    puVar3 = this->elements;
    if (s == 0) {
      uVar1 = 0x4000;
    }
    else {
      puVar2 = puVar3 + 4;
      puVar3 = puVar3 + 1;
      uVar1 = (*puVar2 & 0xff) << 8;
    }
    index = *puVar3;
    uVar4 = this->elements[index] & 0xffffff7f;
  }
  else {
    uVar5 = this->elements[(long)index + 1];
    uVar4 = uVar5 & 0xffffff7f;
    if (0x50004ff < uVar4) {
      uVar4 = 0x5000500;
    }
    if (-1 < (char)uVar5) {
      uVar4 = 0x5000500;
    }
    uVar1 = (this->elements[4] & 0xff) << 8;
  }
  uVar5 = s << 0x10 | t;
  if (uVar4 <= uVar5) {
    puVar2 = this->elements + index;
    do {
      puVar2 = puVar2 + 1;
      uVar4 = *puVar2;
      if (-1 < (char)uVar4) {
        return uVar1;
      }
      if (s < uVar4 >> 0x10) {
        return uVar1;
      }
      uVar4 = uVar4 & 0xffffff7f;
    } while (uVar4 <= uVar5);
  }
  return uVar4 & 0xffff;
}

Assistant:

uint32_t
CollationRootElements::getTertiaryAfter(int32_t index, uint32_t s, uint32_t t) const {
    uint32_t secTer;
    uint32_t terLimit;
    if(index == 0) {
        // primary = 0
        if(s == 0) {
            U_ASSERT(t != 0);
            index = (int32_t)elements[IX_FIRST_TERTIARY_INDEX];
            // Gap at the end of the tertiary CE range.
            terLimit = 0x4000;
        } else {
            index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
            // Gap for tertiaries of primary/secondary CEs.
            terLimit = getTertiaryBoundary();
        }
        secTer = elements[index] & ~SEC_TER_DELTA_FLAG;
    } else {
        U_ASSERT(index >= (int32_t)elements[IX_FIRST_PRIMARY_INDEX]);
        secTer = getFirstSecTerForPrimary(index + 1);
        // If this is an explicit sec/ter unit, then it will be read once more.
        terLimit = getTertiaryBoundary();
    }
    uint32_t st = (s << 16) | t;
    for(;;) {
        if(secTer > st) {
            U_ASSERT((secTer >> 16) == s);
            return secTer & 0xffff;
        }
        secTer = elements[++index];
        // No tertiary greater than t for this primary+secondary.
        if((secTer & SEC_TER_DELTA_FLAG) == 0 || (secTer >> 16) > s) { return terLimit; }
        secTer &= ~SEC_TER_DELTA_FLAG;
    }
}